

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O1

crn_format
crnlib::pixel_format_helpers::convert_pixel_format_to_best_crn_format(pixel_format crn_fmt)

{
  crn_format cVar1;
  crn_format cVar2;
  
  cVar2 = cCRNFmtDXT1;
  cVar1 = cCRNFmtDXT1;
  if ((int)crn_fmt < 0x41424752) {
    if ((int)crn_fmt < 0x32545844) {
      if ((int)crn_fmt < 0x32435445) {
        if (crn_fmt == PIXEL_FMT_ETC1) {
          return cCRNFmtETC1;
        }
        if (crn_fmt == PIXEL_FMT_DXT5A) {
          return cCRNFmtDXT5A;
        }
      }
      else {
        if (crn_fmt == PIXEL_FMT_ETC2) {
          return cCRNFmtETC2;
        }
        if (crn_fmt == PIXEL_FMT_3DC) {
          return cCRNFmtDXN_YX;
        }
      }
    }
    else if ((int)crn_fmt < 0x34545844) {
      if (crn_fmt == PIXEL_FMT_DXT2) {
        return cCRNFmtDXT5;
      }
      if (crn_fmt == PIXEL_FMT_DXT3) {
        return cCRNFmtDXT5;
      }
    }
    else {
      if (crn_fmt == PIXEL_FMT_DXT4) {
        return cCRNFmtDXT5;
      }
      if (crn_fmt == PIXEL_FMT_DXT5) {
        return cCRNFmtDXT5;
      }
      if (crn_fmt == PIXEL_FMT_ETC2A) {
        return cCRNFmtETC2A;
      }
    }
  }
  else if ((int)crn_fmt < 0x52784778) {
    if ((int)crn_fmt < 0x41787878) {
      if (crn_fmt == PIXEL_FMT_A8R8G8B8) {
        return cCRNFmtDXT5;
      }
      cVar1 = cVar2;
      if (crn_fmt == PIXEL_FMT_A8L8) {
        return cCRNFmtDXT5;
      }
    }
    else {
      if (crn_fmt == PIXEL_FMT_A8) {
        return cCRNFmtDXT5;
      }
      if (crn_fmt == PIXEL_FMT_DXT5_AGBR) {
        return cCRNFmtDXT5_AGBR;
      }
      cVar1 = cVar2;
      if (crn_fmt == PIXEL_FMT_DXT5_xGBR) {
        return cCRNFmtDXT5_xGBR;
      }
    }
  }
  else if ((int)crn_fmt < 0x53413245) {
    if (crn_fmt == PIXEL_FMT_DXT5_xGxR) {
      return cCRNFmtDXT5_xGxR;
    }
    if (crn_fmt == PIXEL_FMT_ETC1S) {
      return cCRNFmtETC1S;
    }
  }
  else if (crn_fmt == PIXEL_FMT_ETC2AS) {
    cVar1 = cCRNFmtETC2AS;
  }
  else {
    if (crn_fmt == PIXEL_FMT_DXN) {
      return cCRNFmtDXN_XY;
    }
    cVar1 = cVar2;
    if (crn_fmt == PIXEL_FMT_DXT5_CCxY) {
      return cCRNFmtDXT5_CCxY;
    }
  }
  return cVar1;
}

Assistant:

crn_format convert_pixel_format_to_best_crn_format(pixel_format crn_fmt) {
  crn_format fmt = cCRNFmtDXT1;
  switch (crn_fmt) {
    case PIXEL_FMT_DXT1:
    case PIXEL_FMT_DXT1A:
      fmt = cCRNFmtDXT1;
      break;
    case PIXEL_FMT_DXT2:
    case PIXEL_FMT_DXT3:
    case PIXEL_FMT_DXT4:
    case PIXEL_FMT_DXT5:
      fmt = cCRNFmtDXT5;
      break;
    case PIXEL_FMT_3DC:
      fmt = cCRNFmtDXN_YX;
      break;
    case PIXEL_FMT_DXN:
      fmt = cCRNFmtDXN_XY;
      break;
    case PIXEL_FMT_DXT5A:
      fmt = cCRNFmtDXT5A;
      break;
    case PIXEL_FMT_R8G8B8:
    case PIXEL_FMT_L8:
      fmt = cCRNFmtDXT1;
      break;
    case PIXEL_FMT_A8R8G8B8:
    case PIXEL_FMT_A8:
    case PIXEL_FMT_A8L8:
      fmt = cCRNFmtDXT5;
      break;
    case PIXEL_FMT_DXT5_CCxY:
      fmt = cCRNFmtDXT5_CCxY;
      break;
    case PIXEL_FMT_DXT5_xGBR:
      fmt = cCRNFmtDXT5_xGBR;
      break;
    case PIXEL_FMT_DXT5_AGBR:
      fmt = cCRNFmtDXT5_AGBR;
      break;
    case PIXEL_FMT_DXT5_xGxR:
      fmt = cCRNFmtDXT5_xGxR;
      break;
    case PIXEL_FMT_ETC1:
      fmt = cCRNFmtETC1;
      break;
    case PIXEL_FMT_ETC2:
      fmt = cCRNFmtETC2;
      break;
    case PIXEL_FMT_ETC2A:
      fmt = cCRNFmtETC2A;
      break;
    case PIXEL_FMT_ETC1S:
      fmt = cCRNFmtETC1S;
      break;
    case PIXEL_FMT_ETC2AS:
      fmt = cCRNFmtETC2AS;
      break;
    default: {
      CRNLIB_ASSERT(false);
      break;
    }
  }
  return fmt;
}